

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_ErrorMgr.cpp
# Opt level: O0

StringRef * __thiscall axl::err::ErrorMgr::getErrorDescription(ErrorMgr *this,ErrorRef *error)

{
  long *plVar1;
  ErrorHdr *pEVar2;
  C *pCVar3;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this_00;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *in_RDX;
  long in_RSI;
  StringRef *in_RDI;
  ErrorProvider *provider;
  StringRef *in_stack_ffffffffffffff48;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff50;
  C *in_stack_ffffffffffffff58;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff60;
  uint_t in_stack_ffffffffffffff94;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  byte bVar4;
  ErrorMgr *in_stack_ffffffffffffffa0;
  char local_40 [32];
  ErrorProvider *local_20;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *local_18;
  
  if (*(long *)(in_RSI + 0x78) == 0) {
    local_18 = in_RDX;
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::operator->(in_RDX);
    local_20 = findProvider(in_stack_ffffffffffffffa0,
                            (Guid *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    bVar4 = 0;
    if (local_20 == (ErrorProvider *)0x0) {
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::operator->(local_18);
      sl::Guid::getString((Guid *)CONCAT17(bVar4,in_stack_ffffffffffffff98),
                          in_stack_ffffffffffffff94);
      bVar4 = 1;
      pCVar3 = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                         (in_stack_ffffffffffffff50);
      this_00 = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::operator->(local_18);
      sl::formatString(local_40,"%s::%d",pCVar3,(ulong)*(uint *)((long)&this_00->m_length + 4));
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
                (this_00,in_stack_ffffffffffffff48);
      sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x133564);
    }
    else {
      (**local_20->_vptr_ErrorProvider)(in_RDI,local_20,local_18);
    }
    if ((bVar4 & 1) != 0) {
      sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x133577);
    }
  }
  else {
    plVar1 = *(long **)(in_RSI + 0x78);
    pEVar2 = rc::BufRef::operator_cast_to_ErrorHdr_((BufRef *)in_RDX);
    (**(code **)(*plVar1 + 8))(plVar1,pEVar2);
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  return in_RDI;
}

Assistant:

sl::StringRef
ErrorMgr::getErrorDescription(const ErrorRef& error) {
	if (m_router)
		return m_router->routeErrorDescription(error);

	ErrorProvider* provider = findProvider(error->m_guid);

	return provider ?
		provider->getErrorDescription(error) :
		sl::formatString("%s::%d", error->m_guid.getString().sz(), error->m_code);
}